

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.cpp
# Opt level: O3

bool __thiscall LOTKeyPath::fullyResolvesTo(LOTKeyPath *this,string *key,uint32_t depth)

{
  pointer pbVar1;
  pointer pbVar2;
  size_t sVar3;
  __type _Var4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar7 = (ulong)depth;
  pbVar1 = (this->mKeys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(this->mKeys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (uVar7 <= uVar8) {
    uVar8 = uVar8 - 1;
    iVar5 = std::__cxx11::string::compare((char *)(pbVar1 + uVar7));
    if (iVar5 == 0) {
      if (uVar8 == uVar7) {
        return true;
      }
      uVar8 = (ulong)(depth + 1);
      pbVar1 = (this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar3 = pbVar1[uVar8]._M_string_length;
      if ((sVar3 == key->_M_string_length) &&
         ((sVar3 == 0 ||
          (iVar5 = bcmp(pbVar1[uVar8]._M_dataplus._M_p,(key->_M_dataplus)._M_p,sVar3), iVar5 == 0)))
         ) {
        pbVar2 = (this->mKeys).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar6 = (long)pbVar2 - (long)pbVar1 >> 5;
        if (lVar6 - 2U == uVar7) {
          return true;
        }
        if (lVar6 - 3U == uVar7) {
          iVar5 = std::__cxx11::string::compare((char *)(pbVar2 + -1));
          return iVar5 == 0;
        }
      }
      else if (((long)(this->mKeys).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= uVar8)
      {
        _Var4 = std::operator==(pbVar1 + uVar8,key);
        return _Var4;
      }
    }
    else {
      pbVar2 = (this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = pbVar2 + uVar7;
      sVar3 = pbVar2[uVar7]._M_string_length;
      if ((sVar3 != key->_M_string_length) ||
         ((bVar9 = true, sVar3 != 0 &&
          (iVar5 = bcmp((pbVar1->_M_dataplus)._M_p,(key->_M_dataplus)._M_p,sVar3), iVar5 != 0)))) {
        iVar5 = std::__cxx11::string::compare((char *)pbVar1);
        bVar9 = iVar5 == 0;
      }
      if (uVar8 == uVar7) {
        return bVar9;
      }
      pbVar1 = (this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((((long)pbVar1 -
            (long)(this->mKeys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 2U == uVar7) &&
         (iVar5 = std::__cxx11::string::compare((char *)(pbVar1 + -1)), iVar5 == 0)) {
        return bVar9;
      }
    }
  }
  return false;
}

Assistant:

bool LOTKeyPath::fullyResolvesTo(const std::string key, uint32_t depth)
{
    if (depth > mKeys.size()) {
        return false;
    }

    bool isLastDepth = (depth == size());

    if (!isGlobstar(depth)) {
        bool matches = (mKeys[depth] == key) || isGlob(depth);
        return (isLastDepth || (depth == size() - 1 && endsWithGlobstar())) &&
               matches;
    }

    bool isGlobstarButNextKeyMatches = !isLastDepth && mKeys[depth + 1] == key;
    if (isGlobstarButNextKeyMatches) {
        return depth == size() - 1 ||
               (depth == size() - 2 && endsWithGlobstar());
    }

    if (isLastDepth) {
        return true;
    }

    if (depth + 1 < size()) {
        // We are a globstar but there is more than 1 key after the globstar we
        // we can't fully match.
        return false;
    }
    // Return whether the next key (which we now know is the last one) is the
    // same as the current key.
    return mKeys[depth + 1] == key;
}